

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxCaseStatement::Resolve(FxCaseStatement *this,FCompileContext *ctx)

{
  int iVar1;
  undefined4 extraout_var;
  FxIntCast *this_00;
  undefined4 extraout_var_00;
  undefined1 local_34 [16];
  undefined4 uStack_24;
  FxExpression *pFVar2;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->Condition == (FxExpression *)0x0) {
    return &this->super_FxExpression;
  }
  iVar1 = (*this->Condition->_vptr_FxExpression[2])();
  pFVar2 = (FxExpression *)CONCAT44(extraout_var,iVar1);
  this->Condition = pFVar2;
  if (pFVar2 != (FxExpression *)0x0) {
    iVar1 = (*pFVar2->_vptr_FxExpression[3])(pFVar2);
    if ((char)iVar1 != '\0') {
      pFVar2 = this->Condition;
      if (pFVar2->ValueType == (PType *)TypeName) {
        ExpVal::ExpVal((ExpVal *)(local_34 + 4),(ExpVal *)(pFVar2 + 1));
        ExpVal::GetName((ExpVal *)local_34);
        this->CaseValue = local_34._0_4_;
      }
      else {
        this_00 = (FxIntCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pFVar2);
        FxIntCast::FxIntCast(this_00,this->Condition,false,false);
        this->Condition = (FxExpression *)this_00;
        iVar1 = (*(this_00->super_FxExpression)._vptr_FxExpression[2])(this_00,ctx);
        pFVar2 = (FxExpression *)CONCAT44(extraout_var_00,iVar1);
        this->Condition = pFVar2;
        if (pFVar2 == (FxExpression *)0x0) goto LAB_00518a94;
        ExpVal::ExpVal((ExpVal *)(local_34 + 4),(ExpVal *)(pFVar2 + 1));
        if (*(char *)(local_34._4_8_ + 0x6b) == '\x01') {
          iVar1 = (int)(double)CONCAT44(uStack_24,local_34._12_4_);
        }
        else {
          iVar1 = 0;
          if (*(char *)(local_34._4_8_ + 0x6b) == '\0') {
            iVar1 = local_34._12_4_;
          }
        }
        this->CaseValue = iVar1;
      }
      ExpVal::~ExpVal((ExpVal *)(local_34 + 4));
      return &this->super_FxExpression;
    }
    FScriptPosition::Message
              (&(this->super_FxExpression).ScriptPosition,2,"Case label must be a constant value");
  }
LAB_00518a94:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxCaseStatement::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE_OPT(Condition, ctx);

	if (Condition != nullptr)
	{
		if (!Condition->isConstant())
		{
			ScriptPosition.Message(MSG_ERROR, "Case label must be a constant value");
			delete this;
			return nullptr;
		}
		// Case labels can be ints or names.
		if (Condition->ValueType != TypeName)
		{
			Condition = new FxIntCast(Condition, false);
			SAFE_RESOLVE(Condition, ctx);
			CaseValue = static_cast<FxConstant *>(Condition)->GetValue().GetInt();
		}
		else
		{
			CaseValue = static_cast<FxConstant *>(Condition)->GetValue().GetName();
		}
	}
	return this;
}